

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

Error __thiscall
wave::File::Write(File *this,vector<float,_std::allocator<float>_> *data,
                 _func_void_char_ptr_size_t *encrypt)

{
  float fVar1;
  uint16_t uVar2;
  bool bVar3;
  char cVar4;
  short sVar5;
  int iVar6;
  ulong uVar7;
  pointer pIVar8;
  uint64_t uVar9;
  reference pfVar10;
  size_type sVar11;
  int local_64;
  char local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  int32_t value_3;
  undefined2 uStack_58;
  int8_t value_2 [3];
  int v;
  int16_t value_1;
  int8_t value;
  float sample;
  const_iterator __end1;
  const_iterator __begin1;
  vector<float,_std::allocator<float>_> *__range1;
  uint16_t bits_per_sample;
  uint64_t current_data_size;
  _func_void_char_ptr_size_t *encrypt_local;
  vector<float,_std::allocator<float>_> *data_local;
  File *this_local;
  
  std::unique_ptr<wave::File::Impl,_std::default_delete<wave::File::Impl>_>::operator->
            (&this->impl_);
  uVar7 = std::ofstream::is_open();
  if ((uVar7 & 1) == 0) {
    this_local._4_4_ = kNotOpen;
  }
  else {
    pIVar8 = std::unique_ptr<wave::File::Impl,_std::default_delete<wave::File::Impl>_>::operator->
                       (&this->impl_);
    uVar9 = Impl::current_sample_index(pIVar8);
    pIVar8 = std::unique_ptr<wave::File::Impl,_std::default_delete<wave::File::Impl>_>::operator->
                       (&this->impl_);
    uVar2 = (pIVar8->header).fmt.bits_per_sample;
    __end1 = std::vector<float,_std::allocator<float>_>::begin(data);
    _value_1 = std::vector<float,_std::allocator<float>_>::end(data);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                                       *)&value_1), bVar3) {
      pfVar10 = __gnu_cxx::
                __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
                operator*(&__end1);
      fVar1 = *pfVar10;
      if (uVar2 == 8) {
        cVar4 = std::numeric_limits<signed_char>::max();
        value_2[2] = (int8_t)(int)(fVar1 * (float)(int)cVar4);
        (*encrypt)((int8_t *)((long)register0x00000020 + -0x57) + 2,1);
        pIVar8 = std::unique_ptr<wave::File::Impl,_std::default_delete<wave::File::Impl>_>::
                 operator->(&this->impl_);
        std::ostream::write((char *)&pIVar8->ostream,
                            (long)((int8_t *)((long)register0x00000020 + -0x57) + 2));
      }
      else if (uVar2 == 0x10) {
        sVar5 = std::numeric_limits<short>::max();
        uStack_58 = (undefined2)(int)(fVar1 * (float)(int)sVar5);
        (*encrypt)((char *)&stack0xffffffffffffffa8,2);
        pIVar8 = std::unique_ptr<wave::File::Impl,_std::default_delete<wave::File::Impl>_>::
                 operator->(&this->impl_);
        std::ostream::write((char *)&pIVar8->ostream,(long)&stack0xffffffffffffffa8);
      }
      else if (uVar2 == 0x18) {
        iVar6 = (int)(fVar1 * 8388607.0);
        value_3._0_1_ = (char)iVar6;
        local_5f = (char)value_3;
        value_3._1_1_ = (undefined1)((uint)iVar6 >> 8);
        local_5e = value_3._1_1_;
        value_3._2_1_ = (undefined1)((uint)iVar6 >> 0x10);
        local_5d = value_3._2_1_;
        value_3 = iVar6;
        (*encrypt)(&local_5f,3);
        pIVar8 = std::unique_ptr<wave::File::Impl,_std::default_delete<wave::File::Impl>_>::
                 operator->(&this->impl_);
        std::ostream::write((char *)&pIVar8->ostream,(long)&local_5f);
      }
      else {
        if (uVar2 != 0x20) {
          return kInvalidFormat;
        }
        iVar6 = std::numeric_limits<int>::max();
        local_64 = (int)(fVar1 * (float)iVar6);
        (*encrypt)((char *)&local_64,4);
        pIVar8 = std::unique_ptr<wave::File::Impl,_std::default_delete<wave::File::Impl>_>::
                 operator->(&this->impl_);
        std::ostream::write((char *)&pIVar8->ostream,(long)&local_64);
      }
      __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
      operator++(&__end1);
    }
    pIVar8 = std::unique_ptr<wave::File::Impl,_std::default_delete<wave::File::Impl>_>::operator->
                       (&this->impl_);
    sVar11 = std::vector<float,_std::allocator<float>_>::size(data);
    Impl::WriteHeader(pIVar8,uVar9 + sVar11);
    this_local._4_4_ = kNoError;
  }
  return this_local._4_4_;
}

Assistant:

Error File::Write(const std::vector<float>& data,
                  void (*encrypt)(char* data, size_t size)) {
  if (!impl_->ostream.is_open()) {
    return kNotOpen;
  }

  auto current_data_size = impl_->current_sample_index();
  auto bits_per_sample = impl_->header.fmt.bits_per_sample;

  // write each samples
  for (const auto sample : data) {
    if (bits_per_sample == 8) {
      // 8bits case
      int8_t value =
          static_cast<int8_t>(sample * std::numeric_limits<int8_t>::max());
      encrypt(reinterpret_cast<char*>(&value), sizeof(value) / sizeof(char));
      impl_->ostream.write(reinterpret_cast<char*>(&value), sizeof(value));
    } else if (bits_per_sample == 16) {
      // 16 bits
      int16_t value =
          static_cast<int16_t>(sample * std::numeric_limits<int16_t>::max());
      encrypt(reinterpret_cast<char*>(&value), sizeof(value) / sizeof(char));
      impl_->ostream.write(reinterpret_cast<char*>(&value), sizeof(value));
    } else if (bits_per_sample == 24) {
      // 24bits int doesn't exist in c++. We create a 3 * 8bits struct to
      // simulate
      int v = sample * INT24_MAX;
      int8_t value[3];
      value[0] = reinterpret_cast<char*>(&v)[0];
      value[1] = reinterpret_cast<char*>(&v)[1];
      value[2] = reinterpret_cast<char*>(&v)[2];

      encrypt(reinterpret_cast<char*>(&value), sizeof(value) / sizeof(char));
      impl_->ostream.write(reinterpret_cast<char*>(&value), sizeof(value));
    } else if (bits_per_sample == 32) {
      // 32bits
      int32_t value =
          static_cast<int32_t>(sample * std::numeric_limits<int32_t>::max());
      encrypt(reinterpret_cast<char*>(&value), sizeof(value) / sizeof(char));
      impl_->ostream.write(reinterpret_cast<char*>(&value), sizeof(value));
    } else {
      return kInvalidFormat;
    }
  }

  // update header to show the right data size
  impl_->WriteHeader(current_data_size + data.size());

  return kNoError;
}